

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QString>::
     call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>,tst_qpromise_then::resolveSync()::__0,int_const&>
               (QPromiseResolve<QString> *resolve,QPromiseReject<QString> *reject,
               anon_class_8_1_70098e60 fn,int *args)

{
  QString local_40;
  int *local_28;
  int *args_local;
  QPromiseReject<QString> *reject_local;
  QPromiseResolve<QString> *resolve_local;
  anon_class_8_1_70098e60 fn_local;
  
  local_28 = args;
  args_local = (int *)reject;
  reject_local = (QPromiseReject<QString> *)resolve;
  resolve_local = (QPromiseResolve<QString> *)fn.values;
  tst_qpromise_then::resolveSync::anon_class_8_1_70098e60::operator()
            (&local_40,(anon_class_8_1_70098e60 *)&resolve_local,*args);
  PromiseFulfill<QString>::
  call<QString,QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
            (&local_40,(QPromiseResolve<QString> *)reject_local,
             (QPromiseReject<QString> *)args_local);
  QString::~QString(&local_40);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }